

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::getNodes(LLVMPointerGraphBuilder *this,Value *val)

{
  bool bVar1;
  pointer ppVar2;
  iterator it;
  unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
  local_20 [3];
  PSNodesSeq *local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x15f959);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::Value_*,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq,_std::hash<const_llvm::Value_*>,_std::equal_to<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    local_8 = (PSNodesSeq *)0x0;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>
                           *)0x15f99e);
    local_8 = &ppVar2->second;
  }
  return local_8;
}

Assistant:

PSNodesSeq *getNodes(const llvm::Value *val) {
        auto it = nodes_map.find(val);
        if (it == nodes_map.end())
            return nullptr;

        // the node corresponding to the real llvm value
        // is always the last
        return &it->second;
    }